

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

bool __thiscall
qpdf::Tokenizer::nextToken(Tokenizer *this,InputSource *input,string *context,size_t max_len)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  long lVar5;
  qpdf_offset_t offset;
  char ch;
  char local_41;
  string *local_40;
  string *local_38;
  long lVar3;
  
  if (this->state != st_inline_image) {
    reset(this);
  }
  if (input->buf_len != 0) {
    iVar2 = (*input->_vptr_InputSource[4])(input);
    lVar3 = CONCAT44(extraout_var,iVar2);
    lVar5 = input->buf_start;
    if ((lVar5 <= lVar3) && (lVar3 < lVar5 + input->buf_len)) {
      input->last_offset = lVar3;
      input->buf_idx = lVar3 - lVar5;
      goto LAB_001e4b46;
    }
  }
  input->buf_idx = 0;
  iVar2 = (*input->_vptr_InputSource[7])(input,input->buffer,0x80);
  input->buf_len = CONCAT44(extraout_var_00,iVar2);
  input->buf_start = input->last_offset;
LAB_001e4b46:
  offset = input->last_offset;
  if (this->state != st_token_ready) {
    local_40 = &this->error_message;
    local_38 = &this->raw_val;
    do {
      bVar1 = InputSource::fastRead(input,&local_41);
      if (bVar1) {
        handleCharacter(this,local_41);
        bVar1 = this->before_token;
        if (this->in_token == true) {
          std::__cxx11::string::push_back((char)local_38);
        }
        offset = offset + (ulong)bVar1;
        if (((max_len != 0) && (max_len <= (this->raw_val)._M_string_length)) &&
           (this->state != st_token_ready)) {
          this->type = tt_bad;
          this->state = st_token_ready;
          std::__cxx11::string::_M_replace
                    ((ulong)local_40,0,(char *)(this->error_message)._M_string_length,0x27e398);
        }
      }
      else {
        presentEOF(this);
        if ((this->type == tt_eof) && (this->allow_eof == false)) {
          this->type = tt_bad;
          std::__cxx11::string::_M_replace
                    ((ulong)local_40,0,(char *)(this->error_message)._M_string_length,0x27dd48);
          offset = InputSource::getLastOffset(input);
        }
      }
    } while (this->state != st_token_ready);
  }
  uVar4 = 0;
  if (this->in_token == false) {
    uVar4 = (ulong)this->before_token ^ 1;
  }
  lVar5 = input->last_offset - uVar4;
  input->last_offset = lVar5;
  (*input->_vptr_InputSource[5])(input,lVar5,0);
  if (this->type != tt_eof) {
    InputSource::setLastOffset(input,offset);
  }
  return (this->error_message)._M_string_length == 0;
}

Assistant:

bool
Tokenizer::nextToken(InputSource& input, std::string const& context, size_t max_len)
{
    if (state != st_inline_image) {
        reset();
    }
    qpdf_offset_t offset = input.fastTell();

    while (state != st_token_ready) {
        char ch;
        if (!input.fastRead(ch)) {
            presentEOF();

            if ((type == tt::tt_eof) && (!allow_eof)) {
                // Nothing in the qpdf library calls readToken without allowEOF anymore, so this
                // case is not exercised.
                type = tt::tt_bad;
                error_message = "unexpected EOF";
                offset = input.getLastOffset();
            }
        } else {
            handleCharacter(ch);
            if (before_token) {
                ++offset;
            }
            if (in_token) {
                raw_val += ch;
            }
            if (max_len && (raw_val.length() >= max_len) && (state != st_token_ready)) {
                // terminate this token now
                QTC::TC("qpdf", "QPDFTokenizer block long token");
                type = tt::tt_bad;
                state = st_token_ready;
                error_message = "exceeded allowable length while reading token";
            }
        }
    }

    input.fastUnread(!in_token && !before_token);

    if (type != tt::tt_eof) {
        input.setLastOffset(offset);
    }

    return error_message.empty();
}